

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

void xmlInitializeCatalog(void)

{
  xmlCatalogPrefer xVar1;
  xmlCatalogPtr pxVar2;
  char *pcVar3;
  byte *pbVar4;
  xmlCatalogPtr pxVar5;
  ulong uVar6;
  xmlChar *URL;
  xmlCatalogEntryPtr pxVar7;
  xmlCatalogEntryPtr pxVar8;
  byte *cur;
  long lVar9;
  
  if (xmlCatalogInitialized != '\0') {
    return;
  }
  xmlInitializeCatalogData();
  xmlRMutexLock(xmlCatalogMutex);
  pcVar3 = getenv("XML_DEBUG_CATALOG");
  if (pcVar3 != (char *)0x0) {
    xmlDebugCatalogs = 1;
  }
  pxVar2 = xmlDefaultCatalog;
  if (xmlDefaultCatalog == (xmlCatalogPtr)0x0) {
    pbVar4 = (byte *)getenv("XML_CATALOG_FILES");
    xVar1 = xmlCatalogDefaultPrefer;
    pxVar5 = (xmlCatalogPtr)(*xmlMalloc)(0x78);
    if (pxVar5 == (xmlCatalogPtr)0x0) {
      xmlCatalogErrMemory("allocating catalog");
      pxVar5 = (xmlCatalogPtr)0x0;
    }
    else {
      *(undefined8 *)pxVar5 = 0;
      pxVar5->catalTab[0] = (char *)0x0;
      pxVar5->catalTab[9] = (char *)0x0;
      pxVar5->catalNr = 0;
      pxVar5->catalMax = 0;
      pxVar5->sgml = (xmlHashTablePtr)0x0;
      *(undefined8 *)&pxVar5->prefer = 0;
      pxVar5->catalTab[7] = (char *)0x0;
      pxVar5->catalTab[8] = (char *)0x0;
      pxVar5->catalTab[5] = (char *)0x0;
      pxVar5->catalTab[6] = (char *)0x0;
      pxVar5->catalTab[3] = (char *)0x0;
      pxVar5->catalTab[4] = (char *)0x0;
      pxVar5->catalTab[1] = (char *)0x0;
      pxVar5->catalTab[2] = (char *)0x0;
      pxVar5->xml = (xmlCatalogEntryPtr)0x0;
      pxVar5->type = XML_XML_CATALOG_TYPE;
      pxVar5->catalNr = 0;
      pxVar5->catalMax = 10;
      pxVar5->prefer = xVar1;
    }
    pxVar2 = xmlDefaultCatalog;
    if (pxVar5 != (xmlCatalogPtr)0x0) {
      cur = (byte *)"file:///etc/xml/catalog";
      if (pbVar4 != (byte *)0x0) {
        cur = pbVar4;
      }
      pxVar2 = pxVar5;
      if (*cur != 0) {
        pxVar8 = (xmlCatalogEntryPtr)&pxVar5->xml;
LAB_0013c11a:
        do {
          uVar6 = (ulong)*cur;
          if (uVar6 < 0x21) {
            if ((0x100002600U >> (uVar6 & 0x3f) & 1) != 0) {
              cur = cur + 1;
              goto LAB_0013c11a;
            }
            if (uVar6 != 0) goto LAB_0013c134;
          }
          else {
LAB_0013c134:
            lVar9 = 0;
            while ((0x20 < (ulong)cur[lVar9] ||
                   ((0x100002601U >> ((ulong)cur[lVar9] & 0x3f) & 1) == 0))) {
              lVar9 = lVar9 + 1;
            }
            URL = xmlStrndup(cur,(int)lVar9);
            cur = cur + lVar9;
            if (URL != (xmlChar *)0x0) {
              pxVar7 = xmlNewCatalogEntry(XML_CATA_CATALOG,(xmlChar *)0x0,(xmlChar *)0x0,URL,
                                          xmlCatalogDefaultPrefer,(xmlCatalogEntryPtr)0x0);
              pxVar8->next = pxVar7;
              if (pxVar7 != (xmlCatalogEntryPtr)0x0) {
                pxVar8 = pxVar7;
              }
              (*xmlFree)(URL);
            }
          }
        } while (*cur != 0);
      }
    }
  }
  xmlDefaultCatalog = pxVar2;
  xmlRMutexUnlock(xmlCatalogMutex);
  return;
}

Assistant:

void
xmlInitializeCatalog(void) {
    if (xmlCatalogInitialized != 0)
	return;

    xmlInitializeCatalogData();
    xmlRMutexLock(xmlCatalogMutex);

    if (getenv("XML_DEBUG_CATALOG"))
	xmlDebugCatalogs = 1;

    if (xmlDefaultCatalog == NULL) {
	const char *catalogs;
	char *path;
	const char *cur, *paths;
	xmlCatalogPtr catal;
	xmlCatalogEntryPtr *nextent;

	catalogs = (const char *) getenv("XML_CATALOG_FILES");
	if (catalogs == NULL)
#if defined(_WIN32) && defined(_MSC_VER)
    {
		void* hmodule;
		hmodule = GetModuleHandleA("libxml2.dll");
		if (hmodule == NULL)
			hmodule = GetModuleHandleA(NULL);
		if (hmodule != NULL) {
			char buf[256];
			unsigned long len = GetModuleFileNameA(hmodule, buf, 255);
			if (len != 0) {
				char* p = &(buf[len]);
				while (*p != '\\' && p > buf)
					p--;
				if (p != buf) {
					xmlChar* uri;
					strncpy(p, "\\..\\etc\\catalog", 255 - (p - buf));
					uri = xmlCanonicPath((const xmlChar*)buf);
					if (uri != NULL) {
						strncpy(XML_XML_DEFAULT_CATALOG, uri, 255);
						xmlFree(uri);
					}
				}
			}
		}
		catalogs = XML_XML_DEFAULT_CATALOG;
    }
#else
	    catalogs = XML_XML_DEFAULT_CATALOG;
#endif

	catal = xmlCreateNewCatalog(XML_XML_CATALOG_TYPE,
		xmlCatalogDefaultPrefer);
	if (catal != NULL) {
	    /* the XML_CATALOG_FILES envvar is allowed to contain a
	       space-separated list of entries. */
	    cur = catalogs;
	    nextent = &catal->xml;
	    while (*cur != '\0') {
		while (xmlIsBlank_ch(*cur))
		    cur++;
		if (*cur != 0) {
		    paths = cur;
		    while ((*cur != 0) && (!xmlIsBlank_ch(*cur)))
			cur++;
		    path = (char *) xmlStrndup((const xmlChar *)paths, cur - paths);
		    if (path != NULL) {
			*nextent = xmlNewCatalogEntry(XML_CATA_CATALOG, NULL,
				NULL, BAD_CAST path, xmlCatalogDefaultPrefer, NULL);
			if (*nextent != NULL)
			    nextent = &((*nextent)->next);
			xmlFree(path);
		    }
		}
	    }
	    xmlDefaultCatalog = catal;
	}
    }

    xmlRMutexUnlock(xmlCatalogMutex);
}